

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall QDockAreaLayoutInfo::findSeparator(QDockAreaLayoutInfo *this,QPoint *_pos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QList<int> *i_00;
  qsizetype qVar4;
  const_reference pQVar5;
  ulong uVar6;
  QDockAreaLayoutInfo *in_RDX;
  QRect *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  int next;
  QDockAreaLayoutItem *item;
  int i;
  int pos;
  QRect sepRect;
  QList<int> result;
  QPoint *in_stack_ffffffffffffff68;
  QDockAreaLayoutInfo *this_00;
  undefined4 in_stack_ffffffffffffff8c;
  int index;
  int iVar7;
  undefined1 local_48 [24];
  undefined1 local_30 [16];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI[5].x2.m_i & 1) == 0) {
    this_00 = in_RDI;
    iVar2 = pick((Orientation)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff68);
    iVar7 = 0;
    while( true ) {
      i_00 = (QList<int> *)(long)iVar7;
      qVar4 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RSI + 4));
      if (qVar4 <= (long)i_00) break;
      pQVar5 = QList<QDockAreaLayoutItem>::at((QList<QDockAreaLayoutItem> *)in_RDI,(qsizetype)i_00);
      bVar1 = QDockAreaLayoutItem::skip((QDockAreaLayoutItem *)this_00);
      if ((!bVar1) && ((pQVar5->flags & 1) == 0)) {
        if ((iVar2 < pQVar5->pos + pQVar5->size) && (pQVar5->subinfo != (QDockAreaLayoutInfo *)0x0))
        {
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          findSeparator(in_RDX,(QPoint *)CONCAT44(iVar2,iVar7));
          bVar1 = QList<int>::isEmpty((QList<int> *)0x57250d);
          if (bVar1) {
            memset(in_RDI,0,0x18);
            QList<int>::QList((QList<int> *)0x572553);
          }
          else {
            QList<int>::prepend((QList<int> *)0x57251f,(parameter_type)((ulong)i_00 >> 0x20));
            QList<int>::QList((QList<int> *)in_RDI,i_00);
          }
          QList<int>::~QList((QList<int> *)0x572565);
          goto LAB_005726a9;
        }
        iVar3 = QDockAreaLayoutInfo::next(this_00,(int)((ulong)in_RDI >> 0x20));
        index = (int)((ulong)pQVar5 >> 0x20);
        if ((iVar3 != -1) &&
           (pQVar5 = QList<QDockAreaLayoutItem>::at
                               ((QList<QDockAreaLayoutItem> *)in_RDI,(qsizetype)i_00),
           (pQVar5->flags & 1) == 0)) {
          local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_30 = (undefined1  [16])
                     separatorRect((QDockAreaLayoutInfo *)CONCAT44(iVar2,iVar7),index);
          bVar1 = QRect::isNull((QRect *)in_RDI);
          if ((!bVar1) && (**(int **)in_RSI == 1)) {
            QRect::adjust(in_RSI,(int)((ulong)this_00 >> 0x20),(int)this_00,
                          (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          }
          uVar6 = QRect::contains((QPoint *)local_30,SUB81(in_RDX,0));
          if (((uVar6 & 1) != 0) &&
             (bVar1 = QDockAreaLayoutItem::hasFixedSize
                                ((QDockAreaLayoutItem *)CONCAT44(in_stack_ffffffffffffff8c,iVar3),
                                 (Orientation)((ulong)in_RSI >> 0x20)), !bVar1)) {
            memset(local_48,0,0x18);
            QList<int>::QList((QList<int> *)0x572655);
            QList<int>::operator<<((QList<int> *)in_RDI,(parameter_type)((ulong)i_00 >> 0x20));
            QList<int>::QList((QList<int> *)in_RDI,i_00);
            QList<int>::~QList((QList<int> *)0x57267a);
            goto LAB_005726a9;
          }
        }
      }
      iVar7 = iVar7 + 1;
    }
    memset(in_RDI,0,0x18);
    QList<int>::QList((QList<int> *)0x5726a9);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<int>::QList((QList<int> *)0x572403);
    this_00 = in_RDI;
  }
LAB_005726a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<int> *)this_00;
}

Assistant:

QList<int> QDockAreaLayoutInfo::findSeparator(const QPoint &_pos) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QList<int>();
#endif

    int pos = pick(o, _pos);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip() || (item.flags & QDockAreaLayoutItem::GapItem))
            continue;

        if (item.pos + item.size > pos) {
            if (item.subinfo != nullptr) {
                QList<int> result = item.subinfo->findSeparator(_pos);
                if (!result.isEmpty()) {
                    result.prepend(i);
                    return result;
                } else {
                    return QList<int>();
                }
            }
        }

        int next = this->next(i);
        if (next == -1 || (item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            continue;

        QRect sepRect = separatorRect(i);
        if (!sepRect.isNull() && *sep == 1)
            sepRect.adjust(-2, -2, 2, 2);
        //we also make sure we don't find a separator that's not there
        if (sepRect.contains(_pos) && !item.hasFixedSize(o)) {
            return QList<int>() << i;
        }

    }

    return QList<int>();
}